

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_gen_compute_table_impl.h
# Opt level: O0

void secp256k1_ecmult_gen_compute_table
               (secp256k1_ge_storage *table,secp256k1_ge *gen,int blocks,int teeth,int spacing)

{
  uint32_t uVar1;
  int iVar2;
  ulong uVar3;
  secp256k1_gej *r;
  secp256k1_gej *a;
  secp256k1_gej *b;
  secp256k1_fe *rzr;
  int in_ECX;
  int in_EDX;
  int in_R8D;
  size_t index_1;
  size_t index;
  size_t stride;
  int bit_off;
  secp256k1_gej sum;
  int tooth;
  secp256k1_gej double_u;
  int i;
  int block;
  secp256k1_scalar half;
  size_t vs_pos;
  secp256k1_gej u;
  secp256k1_gej *vs;
  secp256k1_gej *ds;
  secp256k1_ge *prec;
  size_t points_total;
  size_t points;
  secp256k1_gej *in_stack_fffffffffffffda8;
  secp256k1_gej *in_stack_fffffffffffffdb0;
  secp256k1_scalar *in_stack_fffffffffffffdb8;
  ulong uVar4;
  int local_234;
  size_t in_stack_fffffffffffffde0;
  secp256k1_gej *in_stack_fffffffffffffde8;
  secp256k1_ge *in_stack_fffffffffffffdf0;
  secp256k1_ge *in_stack_fffffffffffffe08;
  secp256k1_ge_storage *in_stack_fffffffffffffe10;
  secp256k1_ge *in_stack_fffffffffffffe38;
  secp256k1_gej *in_stack_fffffffffffffe40;
  int local_194;
  int local_f4;
  int local_f0;
  secp256k1_gej *local_e8;
  undefined1 local_e0 [104];
  secp256k1_fe *in_stack_ffffffffffffff88;
  secp256k1_ge *in_stack_ffffffffffffff90;
  secp256k1_gej *in_stack_ffffffffffffff98;
  secp256k1_gej *in_stack_ffffffffffffffa0;
  
  uVar3 = 1L << ((char)in_ECX - 1U & 0x3f);
  r = (secp256k1_gej *)(uVar3 * (long)in_EDX);
  a = (secp256k1_gej *)
      checked_malloc((secp256k1_callback *)in_stack_fffffffffffffdb0,
                     (size_t)in_stack_fffffffffffffda8);
  b = (secp256k1_gej *)
      checked_malloc((secp256k1_callback *)in_stack_fffffffffffffdb0,
                     (size_t)in_stack_fffffffffffffda8);
  rzr = (secp256k1_fe *)
        checked_malloc((secp256k1_callback *)in_stack_fffffffffffffdb0,
                       (size_t)in_stack_fffffffffffffda8);
  local_e8 = (secp256k1_gej *)0x0;
  if (r == (secp256k1_gej *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/ecmult_gen_compute_table_impl.h"
            ,0x1c,"test condition failed: points_total > 0");
    abort();
  }
  secp256k1_scalar_half
            ((secp256k1_scalar *)in_stack_fffffffffffffdb0,
             (secp256k1_scalar *)in_stack_fffffffffffffda8);
  secp256k1_gej_set_infinity((secp256k1_gej *)0x10fc03);
  for (local_f4 = 0xff; -1 < local_f4; local_f4 = local_f4 + -1) {
    secp256k1_gej_double_var
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,(secp256k1_fe *)0x10fc2c);
    uVar1 = secp256k1_scalar_get_bits_limb32
                      (in_stack_fffffffffffffdb8,(uint)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                       (uint)in_stack_fffffffffffffdb0);
    if (uVar1 != 0) {
      secp256k1_gej_add_ge_var
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff88);
    }
  }
  secp256k1_gej_double_var
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,(secp256k1_fe *)0x10fc94);
  iVar2 = secp256k1_gej_eq_ge_var(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  if (iVar2 != 0) {
    for (local_f0 = 0; local_f0 < in_EDX; local_f0 = local_f0 + 1) {
      secp256k1_gej_set_infinity((secp256k1_gej *)0x10fd1b);
      for (local_194 = 0; local_194 < in_ECX; local_194 = local_194 + 1) {
        secp256k1_gej_add_var(r,a,b,rzr);
        secp256k1_gej_double_var
                  (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,(secp256k1_fe *)0x10fd67);
        memcpy(b + local_194,local_e0,0x98);
        if (local_f0 + local_194 != in_EDX + in_ECX + -2) {
          for (local_234 = 1; local_234 < in_R8D; local_234 = local_234 + 1) {
            secp256k1_gej_double_var
                      (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,(secp256k1_fe *)0x10fddf)
            ;
          }
        }
      }
      local_e8 = (secp256k1_gej *)((long)(local_e8->x).n + 1);
      secp256k1_gej_neg(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      for (local_194 = 0; local_194 < in_ECX + -1; local_194 = local_194 + 1) {
        for (uVar4 = 0; uVar4 < (ulong)(1L << ((byte)local_194 & 0x3f)); uVar4 = uVar4 + 1) {
          secp256k1_gej_add_var(r,a,b,rzr);
          local_e8 = (secp256k1_gej *)((long)(local_e8->x).n + 1);
        }
      }
    }
    if (local_e8 == r) {
      secp256k1_ge_set_all_gej_var
                (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      local_f0 = 0;
      do {
        if (in_EDX <= local_f0) {
          free(rzr);
          free(b);
          free(a);
          return;
        }
        for (uVar4 = 0; uVar4 < uVar3; uVar4 = uVar4 + 1) {
          iVar2 = secp256k1_ge_is_infinity((secp256k1_ge *)0x110018);
          if (iVar2 != 0) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/ecmult_gen_compute_table_impl.h"
                    ,0x61,
                    "test condition failed: !secp256k1_ge_is_infinity(&prec[block * points + index])"
                   );
            abort();
          }
          secp256k1_ge_to_storage(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        }
        local_f0 = local_f0 + 1;
      } while( true );
    }
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/ecmult_gen_compute_table_impl.h"
            ,0x59,"test condition failed: vs_pos == points_total");
    abort();
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/ecmult_gen_compute_table_impl.h"
          ,0x2d,"test condition failed: secp256k1_gej_eq_ge_var(&double_u, gen)");
  abort();
}

Assistant:

static void secp256k1_ecmult_gen_compute_table(secp256k1_ge_storage* table, const secp256k1_ge* gen, int blocks, int teeth, int spacing) {
    size_t points = ((size_t)1) << (teeth - 1);
    size_t points_total = points * blocks;
    secp256k1_ge* prec = checked_malloc(&default_error_callback, points_total * sizeof(*prec));
    secp256k1_gej* ds = checked_malloc(&default_error_callback, teeth * sizeof(*ds));
    secp256k1_gej* vs = checked_malloc(&default_error_callback, points_total * sizeof(*vs));
    secp256k1_gej u;
    size_t vs_pos = 0;
    secp256k1_scalar half;
    int block, i;

    VERIFY_CHECK(points_total > 0);

    /* u is the running power of two times gen we're working with, initially gen/2. */
    secp256k1_scalar_half(&half, &secp256k1_scalar_one);
    secp256k1_gej_set_infinity(&u);
    for (i = 255; i >= 0; --i) {
        /* Use a very simple multiplication ladder to avoid dependency on ecmult. */
        secp256k1_gej_double_var(&u, &u, NULL);
        if (secp256k1_scalar_get_bits_limb32(&half, i, 1)) {
            secp256k1_gej_add_ge_var(&u, &u, gen, NULL);
        }
    }
#ifdef VERIFY
    {
        /* Verify that u*2 = gen. */
        secp256k1_gej double_u;
        secp256k1_gej_double_var(&double_u, &u, NULL);
        VERIFY_CHECK(secp256k1_gej_eq_ge_var(&double_u, gen));
    }
#endif

    for (block = 0; block < blocks; ++block) {
        int tooth;
        /* Here u = 2^(block*teeth*spacing) * gen/2. */
        secp256k1_gej sum;
        secp256k1_gej_set_infinity(&sum);
        for (tooth = 0; tooth < teeth; ++tooth) {
            /* Here u = 2^((block*teeth + tooth)*spacing) * gen/2. */
            /* Make sum = sum(2^((block*teeth + t)*spacing), t=0..tooth) * gen/2. */
            secp256k1_gej_add_var(&sum, &sum, &u, NULL);
            /* Make u = 2^((block*teeth + tooth)*spacing + 1) * gen/2. */
            secp256k1_gej_double_var(&u, &u, NULL);
            /* Make ds[tooth] = u = 2^((block*teeth + tooth)*spacing + 1) * gen/2. */
            ds[tooth] = u;
            /* Make u = 2^((block*teeth + tooth + 1)*spacing) * gen/2, unless at the end. */
            if (block + tooth != blocks + teeth - 2) {
                int bit_off;
                for (bit_off = 1; bit_off < spacing; ++bit_off) {
                    secp256k1_gej_double_var(&u, &u, NULL);
                }
            }
        }
        /* Now u = 2^((block*teeth + teeth)*spacing) * gen/2
         *       = 2^((block+1)*teeth*spacing) * gen/2       */

        /* Next, compute the table entries for block number block in Jacobian coordinates.
         * The entries will occupy vs[block*points + i] for i=0..points-1.
         * We start by computing the first (i=0) value corresponding to all summed
         * powers of two times G being negative. */
        secp256k1_gej_neg(&vs[vs_pos++], &sum);
        /* And then teeth-1 times "double" the range of i values for which the table
         * is computed: in each iteration, double the table by taking an existing
         * table entry and adding ds[tooth]. */
        for (tooth = 0; tooth < teeth - 1; ++tooth) {
            size_t stride = ((size_t)1) << tooth;
            size_t index;
            for (index = 0; index < stride; ++index, ++vs_pos) {
                secp256k1_gej_add_var(&vs[vs_pos], &vs[vs_pos - stride], &ds[tooth], NULL);
            }
        }
    }
    VERIFY_CHECK(vs_pos == points_total);

    /* Convert all points simultaneously from secp256k1_gej to secp256k1_ge. */
    secp256k1_ge_set_all_gej_var(prec, vs, points_total);
    /* Convert all points from secp256k1_ge to secp256k1_ge_storage output. */
    for (block = 0; block < blocks; ++block) {
        size_t index;
        for (index = 0; index < points; ++index) {
            VERIFY_CHECK(!secp256k1_ge_is_infinity(&prec[block * points + index]));
            secp256k1_ge_to_storage(&table[block * points + index], &prec[block * points + index]);
        }
    }

    /* Free memory. */
    free(vs);
    free(ds);
    free(prec);
}